

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpChunkedEntityReader::tryReadInternal
          (HttpChunkedEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes,
          size_t alreadyRead)

{
  void *buffer_00;
  size_t maxBytes_00;
  size_t minBytes_00;
  bool bVar1;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *pPVar2;
  Header *in_R9;
  Promise<unsigned_long> PVar3;
  void *local_e8;
  Header *local_e0;
  undefined1 local_d8 [24];
  void *local_c0;
  ArrayDisposer *local_b8;
  size_t local_b0;
  char *local_a8;
  Header *local_a0;
  undefined1 local_98 [40];
  RemoveConst<kj::HttpHeaders::Header> *local_70;
  Header *local_68;
  ArrayDisposer *local_60;
  HttpHeaderTable *local_58;
  Header *local_50;
  Header *local_38;
  size_t alreadyRead_local;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  HttpChunkedEntityReader *this_local;
  
  local_38 = in_R9;
  alreadyRead_local = alreadyRead;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  bVar1 = HttpEntityBodyReader::alreadyDone((HttpEntityBodyReader *)buffer);
  minBytes_00 = minBytes_local;
  maxBytes_00 = maxBytes_local;
  if (bVar1) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)local_38)
    ;
    pPVar2 = extraout_RDX;
  }
  else if (*(long *)((long)buffer + 0x18) == 0) {
    HttpInputStreamImpl::readChunkHeader((HttpInputStreamImpl *)&stack0xffffffffffffffb8);
    local_68 = (Header *)minBytes_local;
    local_60 = (ArrayDisposer *)maxBytes_local;
    local_58 = (HttpHeaderTable *)alreadyRead_local;
    local_50 = local_38;
    local_70 = (RemoveConst<kj::HttpHeaders::Header> *)buffer;
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::_::PropagateException>
              ((Promise<unsigned_long> *)this,(Type *)&stack0xffffffffffffffb8,
               (PropagateException *)&local_70);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffffb8);
    pPVar2 = extraout_RDX_00;
  }
  else if (*(ulong *)((long)buffer + 0x18) < maxBytes_local) {
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)local_98,*(void **)((long)buffer + 8),minBytes_local,
               *(size_t *)((long)buffer + 0x18));
    local_b8 = (ArrayDisposer *)minBytes_local;
    local_b0 = maxBytes_local;
    local_a8 = (char *)alreadyRead_local;
    local_a0 = local_38;
    local_c0 = buffer;
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::_lambda(unsigned_long)_2_,kj::_::PropagateException>
              ((Promise<unsigned_long> *)this,(Type *)local_98,(PropagateException *)&local_c0);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_98);
    pPVar2 = extraout_RDX_01;
  }
  else {
    buffer_00 = *(void **)((long)buffer + 8);
    min<unsigned_long&,unsigned_long&>(&alreadyRead_local,(unsigned_long *)((long)buffer + 0x18));
    HttpInputStreamImpl::tryRead((HttpInputStreamImpl *)local_d8,buffer_00,minBytes_00,maxBytes_00);
    local_e0 = local_38;
    local_e8 = buffer;
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::_lambda(unsigned_long)_3_,kj::_::PropagateException>
              ((Promise<unsigned_long> *)this,(Type *)local_d8,(PropagateException *)&local_e8);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_d8);
    pPVar2 = extraout_RDX_02;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar3.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                  size_t alreadyRead) {
    if (alreadyDone()) {
      return alreadyRead;
    } else if (chunkSize == 0) {
      // Read next chunk header.
      return inner.readChunkHeader().then([=](uint64_t nextChunkSize) {
        if (nextChunkSize == 0) {
          doneReading();
        }

        chunkSize = nextChunkSize;
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      });
    } else if (chunkSize < minBytes) {
      // Read entire current chunk and continue to next chunk.
      return inner.tryRead(buffer, chunkSize, chunkSize)
          .then([=](size_t amount) -> kj::Promise<size_t> {
        chunkSize -= amount;
        if (chunkSize > 0) {
          return KJ_EXCEPTION(DISCONNECTED, "premature EOF in HTTP chunk");
        }

        return tryReadInternal(reinterpret_cast<byte*>(buffer) + amount,
                               minBytes - amount, maxBytes - amount, alreadyRead + amount);
      });
    } else {
      // Read only part of the current chunk.
      return inner.tryRead(buffer, minBytes, kj::min(maxBytes, chunkSize))
          .then([=](size_t amount) -> size_t {
        chunkSize -= amount;
        return alreadyRead + amount;
      });
    }
  }